

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

matd_plu_t * matd_plu(matd_t *a)

{
  size_t sVar1;
  matd_t mVar2;
  undefined1 *__src;
  int i;
  uint *puVar3;
  matd_t *pmVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  undefined1 *__dest;
  ulong uVar12;
  uint uVar13;
  matd_t *pmVar14;
  ulong uVar15;
  double acc;
  double dVar16;
  undefined1 auStack_88 [8];
  ulong local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  size_t local_68;
  matd_t *local_60;
  ulong local_58;
  matd_t *local_50;
  uint *local_48;
  matd_plu_t *local_40;
  int local_34;
  
  puVar3 = (uint *)calloc((ulong)a->nrows,4);
  pmVar4 = matd_copy(a);
  uVar10 = (ulong)a->nrows;
  local_50 = a;
  if (a->nrows == a->ncols) {
    uVar15 = 1;
    local_40 = (matd_plu_t *)calloc(1,0x20);
    for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
      puVar3[uVar5] = (uint)uVar5;
    }
    local_34 = 1;
    local_78 = auStack_88;
    uVar5 = 0;
    pmVar14 = local_50;
    local_48 = puVar3;
    while (uVar5 < uVar10) {
      uVar7 = pmVar14->nrows;
      uVar6 = 0;
      while( true ) {
        uVar8 = (uint)uVar5;
        uVar10 = (ulong)uVar6;
        if (uVar8 < uVar6) {
          uVar10 = uVar5 & 0xffffffff;
        }
        if (uVar6 == uVar7) break;
        uVar9 = pmVar4->ncols * uVar6;
        dVar16 = 0.0;
        uVar12 = uVar5 & 0xffffffff;
        uVar13 = uVar9;
        while (iVar11 = (int)uVar10, uVar10 = (ulong)(iVar11 - 1), iVar11 != 0) {
          dVar16 = dVar16 + (double)pmVar4[(ulong)uVar13 + 1] * (double)pmVar4[uVar12 + 1];
          uVar13 = uVar13 + 1;
          uVar12 = (ulong)((int)uVar12 + pmVar4->ncols);
        }
        uVar10 = (ulong)(uVar9 + uVar8);
        pmVar4[uVar10 + 1] = (matd_t)((double)pmVar4[uVar10 + 1] - dVar16);
        uVar6 = uVar6 + 1;
      }
      local_80 = uVar5 + 1;
      uVar12 = uVar5 & 0xffffffff;
      uVar10 = local_80 & 0xffffffff;
      while( true ) {
        uVar7 = (uint)uVar10;
        uVar6 = (uint)uVar12;
        if (pmVar4->nrows <= uVar7) break;
        uVar13 = uVar7;
        if (ABS((double)pmVar4[(ulong)(pmVar4->ncols * uVar7 + uVar8) + 1]) <=
            ABS((double)pmVar4[(ulong)(pmVar4->ncols * uVar6 + uVar8) + 1])) {
          uVar13 = uVar6;
        }
        uVar10 = (ulong)(uVar7 + 1);
        uVar12 = (ulong)uVar13;
      }
      uVar7 = pmVar4->ncols;
      local_58 = uVar15;
      if (uVar5 != uVar12) {
        __dest = local_78 + -((ulong)uVar7 * 8 + 0xf & 0xfffffffffffffff0);
        sVar1 = (ulong)uVar7 * 8;
        local_70 = __dest;
        local_68 = sVar1;
        local_60 = pmVar4 + (ulong)(uVar7 * uVar6) + 1;
        *(undefined8 *)(__dest + -8) = 0x3c937a;
        memcpy(__dest,pmVar4 + (ulong)(uVar7 * uVar6) + 1,sVar1);
        pmVar14 = local_60;
        sVar1 = local_68;
        *(undefined8 *)(__dest + -8) = 0x3c938f;
        memcpy(pmVar14,pmVar4 + (ulong)(uVar7 * uVar8) + 1,sVar1);
        __src = local_70;
        uVar7 = pmVar4->ncols;
        *(undefined8 *)(__dest + -8) = 0x3c93aa;
        memcpy(pmVar4 + (ulong)(uVar7 * uVar8) + 1,__src,(ulong)uVar7 << 3);
        uVar7 = local_48[(int)uVar6];
        local_48[(int)uVar6] = local_48[uVar5];
        local_48[uVar5] = uVar7;
        local_34 = -local_34;
        uVar7 = pmVar4->ncols;
        pmVar14 = local_50;
      }
      mVar2 = pmVar4[(ulong)((uVar7 + 1) * uVar8) + 1];
      if (ABS((double)mVar2) < 1e-08) {
        local_40->singular = 1;
      }
      if (((uVar5 < uVar7) && (uVar6 = pmVar4->nrows, uVar5 < uVar6)) &&
         (((double)mVar2 != 0.0 || (NAN((double)mVar2))))) {
        uVar8 = uVar7 * (int)local_58 + uVar8;
        for (uVar10 = local_58; uVar10 < uVar6; uVar10 = uVar10 + 1) {
          pmVar4[(ulong)uVar8 + 1] =
               (matd_t)((double)pmVar4[(ulong)uVar8 + 1] * (1.0 / (double)mVar2));
          uVar8 = uVar8 + uVar7;
        }
      }
      uVar15 = local_58 + 1;
      uVar5 = local_80;
      uVar10 = (ulong)pmVar14->ncols;
    }
    local_40->lu = pmVar4;
    local_40->piv = local_48;
    local_40->pivsign = local_34;
    return local_40;
  }
  __assert_fail("a->nrows == a->ncols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x5df,"matd_plu_t *matd_plu(const matd_t *)");
}

Assistant:

matd_plu_t *matd_plu(const matd_t *a)
{
    unsigned int *piv = calloc(a->nrows, sizeof(unsigned int));
    int pivsign = 1;
    matd_t *lu = matd_copy(a);

    // only for square matrices.
    assert(a->nrows == a->ncols);

    matd_plu_t *mlu = calloc(1, sizeof(matd_plu_t));

    for (int i = 0; i < a->nrows; i++)
        piv[i] = i;

    for (int j = 0; j < a->ncols; j++) {
        for (int i = 0; i < a->nrows; i++) {
            int kmax = i < j ? i : j; // min(i,j)

            // compute dot product of row i with column j (up through element kmax)
            double acc = 0;
            for (int k = 0; k < kmax; k++)
                acc += MATD_EL(lu, i, k) * MATD_EL(lu, k, j);

            MATD_EL(lu, i, j) -= acc;
        }

        // find pivot and exchange if necessary.
        int p = j;
        if (1) {
            for (int i = j+1; i < lu->nrows; i++) {
                if (fabs(MATD_EL(lu,i,j)) > fabs(MATD_EL(lu, p, j))) {
                    p = i;
                }
            }
        }

        // swap rows p and j?
        if (p != j) {
            TYPE tmp[lu->ncols];
            memcpy(tmp, &MATD_EL(lu, p, 0), sizeof(TYPE) * lu->ncols);
            memcpy(&MATD_EL(lu, p, 0), &MATD_EL(lu, j, 0), sizeof(TYPE) * lu->ncols);
            memcpy(&MATD_EL(lu, j, 0), tmp, sizeof(TYPE) * lu->ncols);
            int k = piv[p];
            piv[p] = piv[j];
            piv[j] = k;
            pivsign = -pivsign;
        }

        double LUjj = MATD_EL(lu, j, j);

        // If our pivot is very small (which means the matrix is
        // singular or nearly singular), replace with a new pivot of the
        // right sign.
        if (fabs(LUjj) < MATD_EPS) {
/*
            if (LUjj < 0)
                LUjj = -MATD_EPS;
            else
                LUjj = MATD_EPS;

            MATD_EL(lu, j, j) = LUjj;
*/
            mlu->singular = 1;
        }

        if (j < lu->ncols && j < lu->nrows && LUjj != 0) {
            LUjj = 1.0 / LUjj;
            for (int i = j+1; i < lu->nrows; i++)
                MATD_EL(lu, i, j) *= LUjj;
        }
    }

    mlu->lu = lu;
    mlu->piv = piv;
    mlu->pivsign = pivsign;

    return mlu;
}